

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

char * SoapySDRDevice_getTimeSource(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *local_38 [2];
  char local_28 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0013ef28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x260))(local_38,device);
  pcVar2 = strdup(local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_getTimeSource(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->getTimeSource().c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}